

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

void free_timer(JSRuntime *rt,JSOSTimer *th)

{
  JS_FreeValueRT(rt,th->func);
  js_free_rt(rt,th);
  return;
}

Assistant:

static void free_timer(JSRuntime *rt, JSOSTimer *th)
{
    JS_FreeValueRT(rt, th->func);
    js_free_rt(rt, th);
}